

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::get_nonbasicMove(HModel *this,int var)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  int in_ESI;
  HModel *in_RDI;
  int local_4;
  
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->workLower,(long)in_ESI)
  ;
  bVar2 = hsol_isInfinity(in_RDI,-*pvVar3);
  if (bVar2) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->workUpper,(long)in_ESI);
    bVar2 = hsol_isInfinity(in_RDI,*pvVar3);
    if (bVar2) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->workUpper,(long)in_ESI);
    bVar2 = hsol_isInfinity(in_RDI,*pvVar3);
    if (bVar2) {
      local_4 = 1;
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workLower,(long)in_ESI);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workUpper,(long)in_ESI);
      if ((dVar1 != *pvVar3) || (NAN(dVar1) || NAN(*pvVar3))) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int HModel::get_nonbasicMove(int var) {
  //  printf("Calling get_nonbasicMove with var = %2d; numTot = %2d\n", var, numTot); cout<<flush;
  assert(var >= 0);
  assert(var < numTot);
  if (!hsol_isInfinity(-workLower[var])) {
    if (!hsol_isInfinity(workUpper[var])) {
      //Finite lower and upper bounds so nonbasic move depends on whether they are equal
      if (workLower[var] == workUpper[var])
	//Fixed variable so nonbasic move is zero
	return NONBASIC_MOVE_ZE;
	//Boxed variable so nonbasic move is up (from lower bound)
      return NONBASIC_MOVE_UP;}
    else
      //Finite lower bound and infinite upper bound so nonbasic move is up (from lower bound)
      return NONBASIC_MOVE_UP;}
  else
      //Infinite lower bound so nonbasic move depends on whether the upper bound is finite
    if (!hsol_isInfinity(workUpper[var]))
      //Finite upper bound so nonbasic move is down (from upper bound)
      return NONBASIC_MOVE_DN;
  //Infinite upper bound so free variable: nonbasic move is zero
  return NONBASIC_MOVE_ZE;
}